

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O0

void wavread(char *filename,int *fs,int *nbit,double *x)

{
  int iVar1;
  __type _Var2;
  int local_5c;
  int local_58;
  int j;
  int i;
  uchar for_int_number [4];
  double sign_bias;
  double tmp;
  double zero_line;
  int quantization_byte;
  int x_length;
  FILE *fp;
  double *x_local;
  int *nbit_local;
  int *fs_local;
  char *filename_local;
  
  fp = (FILE *)x;
  x_local = (double *)nbit;
  nbit_local = fs;
  fs_local = (int *)filename;
  _quantization_byte = fopen(filename,"rb");
  if (_quantization_byte == (FILE *)0x0) {
    printf("File not found.\n");
  }
  else {
    iVar1 = anon_unknown.dwarf_a35e::CheckHeader((FILE *)_quantization_byte);
    if (iVar1 == 0) {
      fclose(_quantization_byte);
    }
    else {
      iVar1 = anon_unknown.dwarf_a35e::GetParameters
                        ((FILE *)_quantization_byte,nbit_local,(int *)x_local,
                         (int *)((long)&zero_line + 4));
      if (iVar1 == 0) {
        fclose(_quantization_byte);
      }
      else {
        zero_line._0_4_ = *(int *)x_local / 8;
        _Var2 = std::pow<double,int>(2.0,*(int *)x_local + -1);
        for (local_58 = 0; local_58 < zero_line._4_4_; local_58 = local_58 + 1) {
          sign_bias = 0.0;
          _i = 0.0;
          fread(&j,1,(long)zero_line._0_4_,_quantization_byte);
          local_5c = zero_line._0_4_;
          if (0x7f < *(byte *)((long)&j + (long)(zero_line._0_4_ + -1))) {
            _i = std::pow<double,int>(2.0,*(int *)x_local + -1);
            *(byte *)((long)&j + (long)(zero_line._0_4_ + -1)) =
                 *(byte *)((long)&j + (long)(zero_line._0_4_ + -1)) & 0x7f;
            local_5c = zero_line._0_4_;
          }
          while (local_5c = local_5c + -1, -1 < local_5c) {
            sign_bias = sign_bias * 256.0 + (double)*(byte *)((long)&j + (long)local_5c);
          }
          *(double *)(fp + (long)local_58 * 8) = (sign_bias - _i) / _Var2;
        }
        fclose(_quantization_byte);
      }
    }
  }
  return;
}

Assistant:

void wavread(const char* filename, int *fs, int *nbit, double *x) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File not found.\n");
    return;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return;
  }

  int x_length;
  if (0 == GetParameters(fp, fs, nbit, &x_length)) {
    fclose(fp);
    return;
  }

  int quantization_byte = *nbit / 8;
  double zero_line = pow(2.0, *nbit - 1);
  double tmp, sign_bias;
  unsigned char for_int_number[4];
  for (int i = 0; i < x_length; ++i) {
    sign_bias = tmp = 0.0;
    fread(for_int_number, 1, quantization_byte, fp);  // "data"
    if (for_int_number[quantization_byte-1] >= 128) {
      sign_bias = pow(2.0, *nbit - 1);
      for_int_number[quantization_byte - 1] =
        for_int_number[quantization_byte - 1] & 0x7F;
    }
    for (int j = quantization_byte - 1; j >= 0; --j)
      tmp = tmp * 256.0 + for_int_number[j];
    x[i] = (tmp - sign_bias) / zero_line;
  }
  fclose(fp);
}